

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_CopyHeadingTo_Test::TestBody
          (FileDescriptorTest_CopyHeadingTo_Test *this)

{
  byte *pbVar1;
  bool bVar2;
  void *pvVar3;
  undefined1 *puVar4;
  Arena *pAVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  DescriptorPool pool_1;
  FileDescriptorProto other_1;
  FileDescriptor *file_1;
  FileDescriptor *file;
  FileDescriptorProto other;
  FileDescriptorProto proto;
  DescriptorPool pool;
  AssertHelper local_440;
  AssertHelper local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_430;
  undefined1 local_428 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  AssertHelper local_408;
  undefined1 local_400 [8];
  __uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
  local_3f8;
  undefined1 local_388 [8];
  InternalMetadata local_380;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 local_378;
  FileDescriptor *local_290;
  FileDescriptor *local_288;
  undefined1 local_280 [8];
  InternalMetadata local_278;
  undefined4 local_248;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined1 *local_1a0;
  undefined1 local_188 [200];
  ArenaStringPtr local_c0;
  ArenaStringPtr local_b8;
  ArenaStringPtr local_b0 [4];
  DescriptorPool local_90;
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_188,(Arena *)0x0);
  local_188[0x10] = local_188[0x10] | 1;
  pAVar5 = (Arena *)local_188._8_8_;
  if ((local_188._8_8_ & 1) != 0) {
    pAVar5 = *(Arena **)(local_188._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set(&local_c0,value,pAVar5);
  local_188[0x10] = local_188[0x10] | 2;
  pAVar5 = (Arena *)local_188._8_8_;
  if ((local_188._8_8_ & 1) != 0) {
    pAVar5 = *(Arena **)(local_188._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "foo.bar.baz";
  value_00._M_len = 0xb;
  protobuf::internal::ArenaStringPtr::Set(&local_b8,value_00,pAVar5);
  local_188[0x10] = local_188[0x10] | 4;
  pAVar5 = (Arena *)local_188._8_8_;
  if ((local_188._8_8_ & 1) != 0) {
    pAVar5 = *(Arena **)(local_188._8_8_ & 0xfffffffffffffffe);
  }
  value_01._M_str = "proto3";
  value_01._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_b0,value_01,pAVar5);
  local_188[0x10] = local_188[0x10] | 8;
  if (local_b0[1].tagged_ptr_.ptr_ == (void *)0x0) {
    pAVar5 = (Arena *)local_188._8_8_;
    if ((local_188._8_8_ & 1) != 0) {
      pAVar5 = *(Arena **)(local_188._8_8_ & 0xfffffffffffffffe);
    }
    local_b0[1].tagged_ptr_.ptr_ =
         (TaggedStringPtr)Arena::DefaultConstruct<google::protobuf::FileOptions>(pAVar5);
  }
  pbVar1 = (byte *)((long)((long)local_b0[1].tagged_ptr_.ptr_ + 0x10) + 0x18);
  *pbVar1 = *pbVar1 | 1;
  pAVar5 = (Arena *)(((Message *)local_b0[1].tagged_ptr_.ptr_)->super_MessageLite).
                    _internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  value_02._M_str = "foo.bar.baz";
  value_02._M_len = 0xb;
  protobuf::internal::ArenaStringPtr::Set
            (&(((anon_union_160_1_493b367e_for_FileOptions_10 *)
               ((long)local_b0[1].tagged_ptr_.ptr_ + 0x10))->_impl_).java_package_,value_02,pAVar5);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_188 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 1;
  pAVar5 = *(Arena **)((long)pvVar3 + 8);
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  value_03._M_str = "Foo";
  value_03._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar3 + 0xd8),value_03,pAVar5);
  DescriptorPool::DescriptorPool(&local_90);
  local_288 = DescriptorPool::BuildFile(&local_90,(FileDescriptorProto *)local_188);
  local_388 = (undefined1  [8])0x0;
  testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
            ((internal *)local_280,"file","nullptr",&local_288,(void **)local_388);
  if (local_280[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_388);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar6 = *(char **)local_278.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_400,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x225,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_400,(Message *)local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_400);
    if (local_388 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_388 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_278.ptr_);
    }
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_278,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_278.ptr_);
    }
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_280,(Arena *)0x0);
    FileDescriptor::CopyHeadingTo(local_288,(FileDescriptorProto *)local_280);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
              ((internal *)local_388,"other.name()","\"foo.proto\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b8 & 0xfffffffffffffffc),(char (*) [10])0x119907e);
    if (local_388[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_400);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *(char **)local_380.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x229,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_428,(Message *)local_400);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_428);
      if (local_400 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_400 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_380.ptr_);
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
              ((internal *)local_388,"other.package()","\"foo.bar.baz\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b0 & 0xfffffffffffffffc),(char (*) [12])"foo.bar.baz");
    if (local_388[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_400);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *(char **)local_380.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22a,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_428,(Message *)local_400);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_428);
      if (local_400 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_400 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_380.ptr_);
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
              ((internal *)local_388,"other.syntax()","\"proto3\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1a8 & 0xfffffffffffffffc),(char (*) [7])0x119aa77);
    if (local_388[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_400);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *(char **)local_380.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22b,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_428,(Message *)local_400);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_428);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )local_400 !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)local_400 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_380.ptr_);
    }
    puVar4 = local_1a0;
    if ((FileOptions *)local_1a0 == (FileOptions *)0x0) {
      puVar4 = _FileOptions_default_instance_;
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
              ((internal *)local_388,"other.options().java_package()","\"foo.bar.baz\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)(((FileOptions *)puVar4)->field_0)._impl_.java_package_.tagged_ptr_.ptr_ &
               0xfffffffffffffffc),(char (*) [12])"foo.bar.baz");
    if (local_388[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_400);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *(char **)local_380.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22c,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_428,(Message *)local_400);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_428);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_400 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_400 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_380.ptr_);
    }
    local_400[0] = local_248 == 0;
    local_3f8._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
    .
    super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
    ._M_head_impl =
         (tuple<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
          )(_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
            )0x0;
    if (local_248 != 0) {
      testing::Message::Message((Message *)local_428);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_388,(internal *)local_400,
                 (AssertionResult *)"other.message_type().empty()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_438,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22d,(char *)local_388);
      testing::internal::AssertHelper::operator=(&local_438,(Message *)local_428);
      testing::internal::AssertHelper::~AssertHelper(&local_438);
      if (local_388 != (undefined1  [8])&local_378) {
        operator_delete((void *)local_388,local_378._0_8_ + 1);
      }
      if (local_428 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_428 + 8))();
      }
      if (local_3f8._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
          ._M_head_impl !=
          (_Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
           )0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_3f8._M_t.
                     super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
                     .
                     super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
                     ._M_head_impl);
      }
    }
    if ((FileOptions *)local_1a0 == (FileOptions *)0x0) {
      local_1a0 = _FileOptions_default_instance_;
    }
    local_400 = *(undefined1 (*) [8])
                 &((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&((FileOptions *)local_1a0)->field_0 + 0x88))->
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ;
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_400 ==
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      local_400 = (undefined1  [8])&_FeatureSet_default_instance_;
    }
    local_428 = (undefined1  [8])&_FeatureSet_default_instance_;
    testing::internal::
    CmpHelperEQ<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet_const*>
              ((internal *)local_388,"&other.options().features()","&FeatureSet::default_instance()"
               ,(FeatureSet **)local_400,(FeatureSet **)local_428);
    if (local_388[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_400);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *(char **)local_380.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22e,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_428,(Message *)local_400);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_428);
      if (local_400 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_400 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_380.ptr_);
    }
    local_188[0x10] = local_188[0x10] | 4;
    if ((local_188._8_8_ & 1) != 0) {
      local_188._8_8_ = *(undefined8 *)(local_188._8_8_ & 0xfffffffffffffffe);
    }
    value_04._M_str = "editions";
    value_04._M_len = 8;
    protobuf::internal::ArenaStringPtr::Set(local_b0,value_04,(Arena *)local_188._8_8_);
    bVar2 = protobuf::internal::ValidateEnum(1000,(uint32_t *)Edition_internal_data_);
    if (!bVar2) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::Edition_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x34a2,
                    "void google::protobuf::FileDescriptorProto::_internal_set_edition(::google::protobuf::Edition)"
                   );
    }
    local_b0[3].tagged_ptr_.ptr_._0_4_ = 1000;
    local_188[0x10] = local_188[0x10] | 0x20;
    DescriptorPool::DescriptorPool((DescriptorPool *)local_400);
    local_290 = DescriptorPool::BuildFile
                          ((DescriptorPool *)local_400,(FileDescriptorProto *)local_188);
    local_428 = (undefined1  [8])0x0;
    testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
              ((internal *)local_388,"file","nullptr",&local_290,(void **)local_428);
    if (local_388[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_428);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *(char **)local_380.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_438,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x235,pcVar6);
      testing::internal::AssertHelper::operator=(&local_438,(Message *)local_428);
      testing::internal::AssertHelper::~AssertHelper(&local_438);
      if (local_428 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_428 + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_380.ptr_);
      }
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_380,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_380.ptr_);
      }
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_388,(Arena *)0x0);
      FileDescriptor::CopyHeadingTo(local_290,(FileDescriptorProto *)local_388);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                ((internal *)local_428,"other.name()","\"foo.proto\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)local_378._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                 (char (*) [10])0x119907e);
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_420->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x239,pcVar6);
        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        if (local_438.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_438.data_ + 8))();
        }
      }
      if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,local_420);
      }
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
                ((internal *)local_428,"other.package()","\"foo.bar.baz\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)local_378._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                 (char (*) [12])"foo.bar.baz");
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_420->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23a,pcVar6);
        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        if (local_438.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_438.data_ + 8))();
        }
      }
      if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,local_420);
      }
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
                ((internal *)local_428,"other.syntax()","\"editions\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)local_378._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                 (char (*) [9])0x1195b7a);
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_420->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23b,pcVar6);
        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        if (local_438.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_438.data_ + 8))();
        }
      }
      if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,local_420);
      }
      local_438.data_._0_4_ = local_378._impl_.edition_;
      local_440.data_._0_4_ = 1000;
      testing::internal::CmpHelperEQ<google::protobuf::Edition,google::protobuf::Edition>
                ((internal *)local_428,"other.edition()","EDITION_2023",(Edition *)&local_438,
                 (Edition *)&local_440);
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_420->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23c,pcVar6);
        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        if (local_438.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_438.data_ + 8))();
        }
      }
      if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,local_420);
      }
      puVar4 = (undefined1 *)local_378._impl_.options_;
      if (local_378._impl_.options_ == (FileOptions *)0x0) {
        puVar4 = _FileOptions_default_instance_;
      }
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[12]>
                ((internal *)local_428,"other.options().java_package()","\"foo.bar.baz\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(((FileOptions *)puVar4)->field_0)._impl_.java_package_.tagged_ptr_.ptr_ &
                 0xfffffffffffffffc),(char (*) [12])"foo.bar.baz");
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_420->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23d,pcVar6);
        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        if (local_438.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_438.data_ + 8))();
        }
      }
      if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,local_420);
      }
      local_438.data_._0_1_ =
           local_378._impl_.message_type_.super_RepeatedPtrFieldBase.current_size_ == 0;
      local_430 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_378._impl_.message_type_.super_RepeatedPtrFieldBase.current_size_ != 0) {
        testing::Message::Message((Message *)&local_440);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_428,(internal *)&local_438,
                   (AssertionResult *)"other.message_type().empty()","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_408,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23e,(char *)local_428);
        testing::internal::AssertHelper::operator=(&local_408,(Message *)&local_440);
        testing::internal::AssertHelper::~AssertHelper(&local_408);
        if (local_428 != (undefined1  [8])&local_418) {
          operator_delete((void *)local_428,local_418._M_allocated_capacity + 1);
        }
        if (local_440.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_440.data_ + 8))();
        }
        if (local_430 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_430,local_430);
        }
      }
      if (local_378._impl_.options_ == (FileOptions *)0x0) {
        local_378._impl_.options_ = (FileOptions *)_FileOptions_default_instance_;
      }
      local_438.data_ = (AssertHelperData *)((local_378._impl_.options_)->field_0)._impl_.features_;
      if ((FeatureSet *)local_438.data_ == (FeatureSet *)0x0) {
        local_438.data_ = (AssertHelperData *)&_FeatureSet_default_instance_;
      }
      local_440.data_ = (AssertHelperData *)&_FeatureSet_default_instance_;
      testing::internal::
      CmpHelperEQ<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet_const*>
                ((internal *)local_428,"&other.options().features()",
                 "&FeatureSet::default_instance()",(FeatureSet **)&local_438,
                 (FeatureSet **)&local_440);
      if (local_428[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_438);
        if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = (local_420->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23f,pcVar6);
        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        if (local_438.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_438.data_ + 8))();
        }
      }
      if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_420,local_420);
      }
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_388);
    }
    DescriptorPool::~DescriptorPool((DescriptorPool *)local_400);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_280);
  }
  DescriptorPool::~DescriptorPool(&local_90);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_188);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, CopyHeadingTo) {
  FileDescriptorProto proto;
  proto.set_name("foo.proto");
  proto.set_package("foo.bar.baz");
  proto.set_syntax("proto3");
  proto.mutable_options()->set_java_package("foo.bar.baz");

  // Won't be copied.
  proto.add_message_type()->set_name("Foo");

  DescriptorPool pool;
  const FileDescriptor* file = pool.BuildFile(proto);
  ASSERT_NE(file, nullptr);

  FileDescriptorProto other;
  file->CopyHeadingTo(&other);
  EXPECT_EQ(other.name(), "foo.proto");
  EXPECT_EQ(other.package(), "foo.bar.baz");
  EXPECT_EQ(other.syntax(), "proto3");
  EXPECT_EQ(other.options().java_package(), "foo.bar.baz");
  EXPECT_TRUE(other.message_type().empty());
  EXPECT_EQ(&other.options().features(), &FeatureSet::default_instance());
  {
    proto.set_syntax("editions");
    proto.set_edition(EDITION_2023);

    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_NE(file, nullptr);

    FileDescriptorProto other;
    file->CopyHeadingTo(&other);
    EXPECT_EQ(other.name(), "foo.proto");
    EXPECT_EQ(other.package(), "foo.bar.baz");
    EXPECT_EQ(other.syntax(), "editions");
    EXPECT_EQ(other.edition(), EDITION_2023);
    EXPECT_EQ(other.options().java_package(), "foo.bar.baz");
    EXPECT_TRUE(other.message_type().empty());
    EXPECT_EQ(&other.options().features(), &FeatureSet::default_instance());
  }
}